

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O0

void __thiscall Lodtalk::AST::ArgumentList::ArgumentList(ArgumentList *this,Argument *firstArgument)

{
  Argument *local_18;
  Argument *firstArgument_local;
  ArgumentList *this_local;
  
  local_18 = firstArgument;
  firstArgument_local = (Argument *)this;
  Node::Node(&this->super_Node);
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__ArgumentList_0020cd38;
  std::vector<Lodtalk::AST::Argument_*,_std::allocator<Lodtalk::AST::Argument_*>_>::vector
            (&this->arguments);
  std::vector<Lodtalk::AST::Argument_*,_std::allocator<Lodtalk::AST::Argument_*>_>::push_back
            (&this->arguments,&local_18);
  return;
}

Assistant:

ArgumentList::ArgumentList(Argument *firstArgument)
{
	arguments.push_back(firstArgument);
}